

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disflow.c
# Opt level: O2

void get_cubic_kernel_dbl(double x,double *kernel)

{
  double dVar1;
  double dVar2;
  
  dVar2 = x * x;
  dVar1 = dVar2 * x;
  *kernel = dVar1 * -0.5 + x * -0.5 + dVar2;
  kernel[1] = dVar1 * 1.5 + dVar2 * -2.5 + 1.0;
  kernel[2] = dVar1 * -1.5 + x * 0.5 + dVar2 + dVar2;
  kernel[3] = dVar2 * -0.5 + dVar1 * 0.5;
  return;
}

Assistant:

static inline void get_cubic_kernel_dbl(double x, double kernel[4]) {
  // Check that the fractional position is in range.
  //
  // Note: x is calculated from, e.g., `u_frac = u - floor(u)`.
  // Mathematically, this implies that 0 <= x < 1. However, in practice it is
  // possible to have x == 1 due to floating point rounding. This is fine,
  // and we still interpolate correctly if we allow x = 1.
  assert(0 <= x && x <= 1);

  double x2 = x * x;
  double x3 = x2 * x;
  kernel[0] = -0.5 * x + x2 - 0.5 * x3;
  kernel[1] = 1.0 - 2.5 * x2 + 1.5 * x3;
  kernel[2] = 0.5 * x + 2.0 * x2 - 1.5 * x3;
  kernel[3] = -0.5 * x2 + 0.5 * x3;
}